

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRPluginManager.cpp
# Opt level: O2

void __thiscall MinVR::VRPluginManager::~VRPluginManager(VRPluginManager *this)

{
  pointer ppVVar1;
  VRPlugin *pVVar2;
  pointer ppVVar3;
  VRSharedLibrary *pVVar4;
  size_t f;
  ulong uVar5;
  
  this->_vptr_VRPluginManager = (version_t **)&PTR__VRPluginManager_0015c9a8;
  uVar5 = 0;
  while( true ) {
    ppVVar1 = (this->_plugins).
              super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_plugins).
                      super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3) <= uVar5)
    break;
    pVVar2 = ppVVar1[uVar5];
    (**(code **)(*(long *)pVVar2 + 0x18))(pVVar2,this->_vrMain);
    pVVar2 = (this->_plugins).
             super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5];
    if (pVVar2 != (VRPlugin *)0x0) {
      (**(code **)(*(long *)pVVar2 + 8))();
    }
    uVar5 = uVar5 + 1;
  }
  uVar5 = 0;
  while( true ) {
    ppVVar3 = (this->_libraries).
              super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->_libraries).
                      super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3 >> 3) <= uVar5)
    break;
    pVVar4 = ppVVar3[uVar5];
    if (pVVar4 != (VRSharedLibrary *)0x0) {
      (*pVVar4->_vptr_VRSharedLibrary[1])();
    }
    uVar5 = uVar5 + 1;
  }
  std::_Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>::
  ~_Vector_base(&(this->_libraries).
                 super__Vector_base<MinVR::VRSharedLibrary_*,_std::allocator<MinVR::VRSharedLibrary_*>_>
               );
  std::_Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>::~_Vector_base
            (&(this->_plugins).
              super__Vector_base<MinVR::VRPlugin_*,_std::allocator<MinVR::VRPlugin_*>_>);
  return;
}

Assistant:

VRPluginManager::~VRPluginManager() {
	for (size_t f = 0; f < _plugins.size(); f++)
	{
		_plugins[f]->unregisterWithMinVR(_vrMain);
		delete _plugins[f];
	}

	for (size_t f = 0; f < _libraries.size(); f++)
	{
		delete _libraries[f];
	}
}